

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGeneratorObjectStrings::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  bool bVar1;
  string *psVar2;
  string *obj_local;
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&this->StateDir);
  bVar1 = cmStateDirectory::ContainsBoth(&this->StateDir,psVar2,obj);
  if (bVar1) {
    psVar2 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&this->StateDir);
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,psVar2,obj);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)obj);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MaybeConvertToRelativePath(std::string const& obj)
  {
    if (!this->StateDir.ContainsBoth(this->StateDir.GetCurrentBinary(), obj)) {
      return obj;
    }
    return cmSystemTools::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), obj);
  }